

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O0

int Saig_SynchCountX(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords,int *piPat)

{
  Vec_Ptr_t *p;
  int iVar1;
  void *__ptr;
  void *pvVar2;
  long lVar3;
  int local_54;
  int local_50;
  int iTernMin;
  int iPatBest;
  int b;
  int w;
  int i;
  int *pCounters;
  uint *pSim;
  Aig_Obj_t *pObj;
  int *piPat_local;
  int nWords_local;
  Vec_Ptr_t *vSimInfo_local;
  Aig_Man_t *pAig_local;
  
  __ptr = calloc((long)(nWords << 4),4);
  for (b = 0; iVar1 = Saig_ManRegNum(pAig), b < iVar1; b = b + 1) {
    p = pAig->vCos;
    iVar1 = Saig_ManPoNum(pAig);
    pvVar2 = Vec_PtrEntry(p,b + iVar1);
    pvVar2 = Vec_PtrEntry(vSimInfo,*(int *)((long)pvVar2 + 0x24));
    for (iPatBest = 0; iPatBest < nWords; iPatBest = iPatBest + 1) {
      for (iTernMin = 0; iTernMin < 0x10; iTernMin = iTernMin + 1) {
        if ((*(uint *)((long)pvVar2 + (long)iPatBest * 4) >> ((byte)(iTernMin << 1) & 0x1f) & 3) ==
            3) {
          lVar3 = (long)(iPatBest * 0x10 + iTernMin);
          *(int *)((long)__ptr + lVar3 * 4) = *(int *)((long)__ptr + lVar3 * 4) + 1;
        }
      }
    }
  }
  local_50 = -1;
  local_54 = Saig_ManRegNum(pAig);
  local_54 = local_54 + 1;
  for (iTernMin = 0; iTernMin < nWords * 0x10; iTernMin = iTernMin + 1) {
    if (*(int *)((long)__ptr + (long)iTernMin * 4) < local_54) {
      local_54 = *(int *)((long)__ptr + (long)iTernMin * 4);
      local_50 = iTernMin;
      if (local_54 == 0) break;
    }
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  *piPat = local_50;
  return local_54;
}

Assistant:

int Saig_SynchCountX( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords, int * piPat )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int * pCounters, i, w, b;
    int iPatBest, iTernMin;
    // count the number of ternary values in each pattern
    pCounters = ABC_CALLOC( int, nWords * 16 );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            for ( b = 0; b < 16; b++ )
                if ( ((pSim[w] >> (b << 1)) & 3) == 3 )
                    pCounters[16 * w + b]++;
    }
    // get the best pattern
    iPatBest = -1;
    iTernMin = 1 + Saig_ManRegNum(pAig);
    for ( b = 0; b < 16 * nWords; b++ )
        if ( iTernMin > pCounters[b] )
        {
            iTernMin = pCounters[b];
            iPatBest = b;
            if ( iTernMin == 0 )
                break;
        }
    ABC_FREE( pCounters );
    *piPat = iPatBest;
    return iTernMin;
}